

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_divull_m68k(CPUM68KState_conflict *env,int numr,int regr,uint32_t den)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t uVar3;
  uintptr_t unaff_retaddr;
  
  if (den == 0) {
    *(undefined4 *)(env[-3].fregs + 2) = 5;
    cpu_loop_exit_restore_m68k((CPUState *)(env[-0x40].fregs + 2),unaff_retaddr);
  }
  auVar1._4_4_ = env->dregs[regr];
  auVar1._0_4_ = env->dregs[numr];
  auVar1._8_8_ = 0;
  auVar2 = auVar1 / ZEXT416(den);
  env->cc_c = 0;
  if (auVar2._0_8_ >> 0x20 != 0) {
    env->cc_v = 0xffffffff;
    env->cc_z = 1;
    return;
  }
  uVar3 = auVar2._0_4_;
  env->cc_z = uVar3;
  env->cc_n = uVar3;
  env->cc_v = 0;
  env->dregs[regr] = SUB164(auVar1 % ZEXT416(den),0);
  env->dregs[numr] = uVar3;
  return;
}

Assistant:

void HELPER(divull)(CPUM68KState *env, int numr, int regr, uint32_t den)
{
    uint64_t num = deposit64(env->dregs[numr], 32, 32, env->dregs[regr]);
    uint64_t quot;
    uint32_t rem;

    if (den == 0) {
        raise_exception_ra(env, EXCP_DIV0, GETPC());
    }
    quot = num / den;
    rem = num % den;

    env->cc_c = 0; /* always cleared, even if overflow */
    if (quot > 0xffffffffULL) {
        env->cc_v = -1;
        /*
         * real 68040 keeps N and unset Z on overflow,
         * whereas documentation says "undefined"
         */
        env->cc_z = 1;
        return;
    }
    env->cc_z = quot;
    env->cc_n = quot;
    env->cc_v = 0;

    /*
     * If Dq and Dr are the same, the quotient is returned.
     * therefore we set Dq last.
     */

    env->dregs[regr] = rem;
    env->dregs[numr] = quot;
}